

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.h
# Opt level: O0

void JitFFI::OpCode_x64::_mov_offset_header<(unsigned_char)64>
               (JitFuncCreater *jfc,Register dst,Register src)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  Register src_local;
  Register dst_local;
  JitFuncCreater *jfc_local;
  
  bVar1 = is_rx(dst);
  if ((bVar1) && (bVar1 = is_prx(src), bVar1)) {
    bVar2 = _get_mov_head_rpxq(src,dst);
    bVar3 = get_code(src);
    JitFuncCreater::push(jfc,bVar2,0x8b,bVar3 + '@');
    if ((src == prbp) || (src == pr12)) {
      JitFuncCreater::push(jfc,'$');
    }
  }
  else {
    bVar1 = is_prx(dst);
    if ((!bVar1) || (bVar1 = is_rx(src), !bVar1)) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/include/opcode.h"
                    ,0x197,
                    "void JitFFI::OpCode_x64::_mov_offset_header(JitFuncCreater &, Register, Register) [V = (unsigned char)\'@\']"
                   );
    }
    bVar2 = _get_mov_head_rpxq(dst,src);
    bVar3 = get_code(dst);
    JitFuncCreater::push(jfc,bVar2,0x89,bVar3 + '@');
    if ((dst == prbp) || (dst == pr12)) {
      JitFuncCreater::push(jfc,'$');
    }
  }
  return;
}

Assistant:

inline void _mov_offset_header(JitFuncCreater &jfc, Register dst, Register src) {
			if (is_rx(dst) && is_prx(src)) {
				jfc.push(_get_mov_head_rpxq(src, dst), 0x8b, V + get_code(src));
				if (src == prbp || src == pr12)
					jfc.push(0x24);
			}
			else if (is_prx(dst) && is_rx(src)) {
				jfc.push(_get_mov_head_rpxq(dst, src), 0x89, V + get_code(dst));
				if (dst == prbp || dst == pr12)
					jfc.push(0x24);
			}
			else
				assert(false);
		}